

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void merge_cache_lcp_2way<false,unsigned_int>
               (uchar **from0,lcp_t *lcp_input0,uint *cache_input0,size_t n0,uchar **from1,
               lcp_t *lcp_input1,uint *cache_input1,size_t n1,uchar **result,lcp_t *lcp_result,
               uint *cache_result)

{
  size_t sVar1;
  uchar **ppuVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  lcp_t lVar7;
  uchar **__dest;
  uchar **ppuVar8;
  lcp_t *local_90;
  uint *local_88;
  size_t local_80;
  uchar **local_70;
  uint *local_68;
  lcp_t *local_60;
  size_t local_58;
  size_t local_50;
  size_t local_40;
  int local_38;
  
  check_input<unsigned_int>(from0,lcp_input0,cache_input0,n0);
  local_58 = n1;
  check_input<unsigned_int>(from1,lcp_input1,cache_input1,n1);
  local_88 = cache_input0 + 1;
  uVar4 = *cache_input0;
  local_68 = cache_input1 + 1;
  uVar5 = *cache_input1;
  local_60 = lcp_input1;
  if (uVar4 < uVar5) {
    iVar3 = cmp(*from0,*from1);
    if (-1 < iVar3) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                   );
    }
    uVar4 = lcp(uVar4,uVar5);
    if (uVar4 == 0) {
      local_50 = 0;
    }
    else {
      local_50 = (size_t)uVar4;
      uVar5 = get_char<unsigned_int>(*from1,local_50);
    }
    *result = *from0;
    local_80 = n0 - 1;
    if (local_80 == 0) goto LAB_001d0446;
    from0 = from0 + 1;
    local_90 = lcp_input0 + 1;
    uVar4 = cache_input0[1];
    local_88 = cache_input0 + 2;
    lVar7 = *lcp_input0;
    ppuVar8 = result + 1;
    ppuVar2 = from1;
LAB_001cffe3:
    do {
      while( true ) {
        local_70 = ppuVar2;
        check_lcp_and_cache<unsigned_int>(ppuVar8[-1],*from0,lVar7,uVar4,*local_70,local_50,uVar5);
        if (lVar7 <= local_50) break;
        iVar3 = cmp(*from0,*local_70);
        if (-1 < iVar3) {
          __assert_fail("cmp(*from0, *from1) < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x4ae,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                       );
        }
        *ppuVar8 = *from0;
        lVar7 = *local_90;
        uVar4 = *local_88;
joined_r0x001d02e0:
        local_80 = local_80 - 1;
        local_88 = local_88 + 1;
        local_90 = local_90 + 1;
        __dest = ppuVar8 + 1;
        from0 = from0 + 1;
        ppuVar8 = ppuVar8 + 1;
        ppuVar2 = local_70;
        if (local_80 == 0) goto LAB_001d0449;
      }
      if (local_50 <= lVar7) {
        if (uVar4 < uVar5) {
          iVar3 = cmp(*from0,*local_70);
          if (-1 < iVar3) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4c6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                         );
          }
          uVar4 = lcp(uVar4,uVar5);
          if (uVar4 != 0) {
            local_50 = local_50 + uVar4;
            uVar5 = get_char<unsigned_int>(*local_70,local_50);
          }
          *ppuVar8 = *from0;
          lVar7 = *local_90;
          uVar4 = *local_88;
        }
        else {
          if (uVar5 < uVar4) {
            iVar3 = cmp(*from0,*local_70);
            if (iVar3 < 1) {
              __assert_fail("cmp(*from0, *from1) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4d6,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                           );
            }
            uVar5 = lcp(uVar4,uVar5);
            if (uVar5 != 0) {
              lVar7 = lVar7 + uVar5;
              uVar4 = get_char<unsigned_int>(*from0,lVar7);
            }
            *ppuVar8 = *local_70;
            local_50 = *local_60;
            uVar5 = *local_68;
            goto joined_r0x001d0332;
          }
          if ((char)uVar4 == '\0') {
            iVar3 = cmp(*from0,*local_70);
            if (iVar3 != 0) {
              __assert_fail("cmp(*from0, *from1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4e7,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                           );
            }
            *ppuVar8 = *from0;
            lVar7 = *local_90;
            uVar6 = lcp(uVar4,uVar5);
            uVar4 = *local_88;
            uVar5 = 0;
            local_50 = local_50 + uVar6;
          }
          else {
            compare((uchar *)&local_40,*from0,(size_t)*local_70);
            lVar7 = local_40;
            local_50 = lVar7;
            if (local_38 < 0) {
              *ppuVar8 = *from0;
              lVar7 = *local_90;
              uVar4 = *local_88;
              uVar5 = get_char<unsigned_int>(*local_70,local_40);
            }
            else {
              if (local_38 != 0) {
                *ppuVar8 = *local_70;
                local_50 = *local_60;
                uVar4 = get_char<unsigned_int>(*from0,local_40);
                uVar5 = *local_68;
                goto joined_r0x001d0332;
              }
              *ppuVar8 = *from0;
              lVar7 = *local_90;
              uVar4 = *local_88;
              uVar5 = 0;
            }
          }
        }
        goto joined_r0x001d02e0;
      }
      iVar3 = cmp(*from0,*local_70);
      if (iVar3 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4b7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                     );
      }
      *ppuVar8 = *local_70;
      local_50 = *local_60;
      uVar5 = *local_68;
joined_r0x001d0332:
      local_60 = local_60 + 1;
      local_68 = local_68 + 1;
      ppuVar2 = local_70 + 1;
      __dest = ppuVar8 + 1;
      local_58 = local_58 - 1;
      local_70 = from0;
      ppuVar8 = __dest;
    } while (local_58 != 0);
  }
  else {
    local_70 = from0;
    local_80 = n0;
    local_90 = lcp_input0;
    if (uVar4 <= uVar5) {
      if ((char)uVar4 == '\0') {
        iVar3 = cmp(*from0,*from1);
        if (iVar3 != 0) {
          __assert_fail("cmp(*from0, *from1) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x470,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                       );
        }
        uVar5 = lcp(uVar4,uVar5);
        *result = *from0;
        ppuVar8 = result + 1;
        local_80 = n0 - 1;
        if (local_80 == 0) {
LAB_001d0446:
          __dest = result + 1;
          local_70 = from1;
LAB_001d0449:
          local_80 = local_58;
          if (local_58 == 0) {
            __assert_fail("n1",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x51e,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                         );
          }
          goto LAB_001d0463;
        }
        from0 = from0 + 1;
        lVar7 = *lcp_input0;
        local_90 = lcp_input0 + 1;
        local_50 = (size_t)uVar5;
        uVar4 = cache_input0[1];
        local_88 = cache_input0 + 2;
        uVar5 = 0;
        ppuVar2 = from1;
      }
      else {
        compare((uchar *)&local_40,*from0,(size_t)*from1);
        sVar1 = local_40;
        local_50 = sVar1;
        if (local_38 < 0) {
          *result = *from0;
          ppuVar8 = result + 1;
          lVar7 = *lcp_input0;
          uVar4 = cache_input0[1];
          uVar5 = get_char<unsigned_int>(*from1,local_40);
          local_80 = n0 - 1;
          if (local_80 == 0) goto LAB_001d0446;
          from0 = from0 + 1;
          local_90 = lcp_input0 + 1;
          local_88 = cache_input0 + 2;
          ppuVar2 = from1;
        }
        else {
          __dest = result + 1;
          ppuVar8 = __dest;
          if (local_38 == 0) {
            *result = *from0;
            local_80 = n0 - 1;
            local_70 = from1;
            if (local_80 == 0) goto LAB_001d0449;
            from0 = from0 + 1;
            lVar7 = *lcp_input0;
            local_90 = lcp_input0 + 1;
            uVar4 = cache_input0[1];
            local_88 = cache_input0 + 2;
            uVar5 = 0;
            ppuVar2 = from1;
          }
          else {
            *result = *from1;
            local_50 = *lcp_input1;
            uVar4 = get_char<unsigned_int>(*from0,local_40);
            local_58 = n1 - 1;
            if (local_58 == 0) goto LAB_001d03c5;
            local_60 = lcp_input1 + 1;
            uVar5 = cache_input1[1];
            local_68 = cache_input1 + 2;
            lVar7 = sVar1;
            ppuVar2 = from1 + 1;
          }
        }
      }
      goto LAB_001cffe3;
    }
    iVar3 = cmp(*from0,*from1);
    if (iVar3 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                   );
    }
    uVar5 = lcp(uVar4,uVar5);
    if (uVar5 == 0) {
      lVar7 = 0;
    }
    else {
      lVar7 = (lcp_t)uVar5;
      uVar4 = get_char<unsigned_int>(*from0,lVar7);
    }
    *result = *from1;
    __dest = result + 1;
    local_58 = n1 - 1;
    if (local_58 != 0) {
      local_60 = lcp_input1 + 1;
      uVar5 = cache_input1[1];
      local_68 = cache_input1 + 2;
      local_50 = *lcp_input1;
      ppuVar8 = __dest;
      ppuVar2 = from1 + 1;
      goto LAB_001cffe3;
    }
  }
LAB_001d03c5:
  if (local_80 == 0) {
    __assert_fail("n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x527,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned int]"
                 );
  }
LAB_001d0463:
  memmove(__dest,local_70,local_80 << 3);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}